

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

float __thiscall nv::FloatImage::sampleLinearClamp(FloatImage *this,float x,float y,int c)

{
  ushort uVar1;
  ushort uVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  fVar11 = x * (float)uVar1;
  fVar14 = (float)uVar2 * y;
  fVar12 = floorf(fVar11);
  fVar11 = fVar11 - fVar12;
  fVar13 = floorf(fVar14);
  iVar9 = (int)fVar12;
  fVar14 = fVar14 - fVar13;
  iVar8 = (int)fVar13;
  iVar7 = 0;
  if (0 < iVar8) {
    iVar7 = iVar8;
  }
  if (iVar8 < 0) {
    iVar8 = -1;
  }
  iVar5 = 0;
  if (0 < iVar9) {
    iVar5 = iVar9;
  }
  iVar6 = -1;
  if (-1 < iVar9) {
    iVar6 = iVar9;
  }
  iVar9 = uVar1 - 1;
  if (iVar9 < iVar5) {
    iVar5 = iVar9;
  }
  iVar10 = uVar2 - 1;
  if (iVar10 < iVar7) {
    iVar7 = iVar10;
  }
  iVar4 = iVar6 + 1;
  if (iVar9 < iVar6 + 1) {
    iVar4 = iVar9;
  }
  iVar9 = iVar8 + 1;
  if (iVar10 < iVar8 + 1) {
    iVar9 = iVar10;
  }
  pfVar3 = this->m_mem;
  iVar6 = c * (uint)uVar2;
  iVar8 = (iVar7 + iVar6) * (uint)uVar1;
  iVar7 = (iVar6 + iVar9) * (uint)uVar1;
  return ((1.0 - fVar11) * pfVar3[(uint)(iVar5 + iVar7)] + fVar11 * pfVar3[(uint)(iVar7 + iVar4)]) *
         fVar14 + (1.0 - fVar14) *
                  (pfVar3[(uint)(iVar8 + iVar5)] * (1.0 - fVar11) +
                  pfVar3[(uint)(iVar8 + iVar4)] * fVar11);
}

Assistant:

float FloatImage::sampleLinearClamp(float x, float y, const int c) const
{
	const int w = m_width;
	const int h = m_height;
	
	x *= w;
	y *= h;
	
	const float fracX = frac(x);
	const float fracY = frac(y);
	
	const int ix0 = ::clamp(ifloor(x), 0, w-1);
	const int iy0 = ::clamp(ifloor(y), 0, h-1);
	const int ix1 = ::clamp(ifloor(x)+1, 0, w-1);
	const int iy1 = ::clamp(ifloor(y)+1, 0, h-1);

	float f1 = pixel(ix0, iy0, c);
	float f2 = pixel(ix1, iy0, c);
	float f3 = pixel(ix0, iy1, c);
	float f4 = pixel(ix1, iy1, c);
	
	float i1 = lerp(f1, f2, fracX);
	float i2 = lerp(f3, f4, fracX);

	return lerp(i1, i2, fracY);
}